

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flcFORTRAN_wrap.cxx
# Opt level: O0

void SWIG_store_exception(char *decl,int errcode,char *msg)

{
  int iVar1;
  char *in_RDX;
  int in_ESI;
  char *in_RDI;
  
  flc_ierr = in_ESI;
  if (SWIG_store_exception::last_exception_msg_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&SWIG_store_exception::last_exception_msg_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&SWIG_store_exception::last_exception_msg_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &SWIG_store_exception::last_exception_msg_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SWIG_store_exception::last_exception_msg_abi_cxx11_);
    }
  }
  std::__cxx11::string::operator=
            ((string *)&SWIG_store_exception::last_exception_msg_abi_cxx11_,"In ");
  std::__cxx11::string::operator+=
            ((string *)&SWIG_store_exception::last_exception_msg_abi_cxx11_,in_RDI);
  std::__cxx11::string::operator+=
            ((string *)&SWIG_store_exception::last_exception_msg_abi_cxx11_,": ");
  std::__cxx11::string::operator+=
            ((string *)&SWIG_store_exception::last_exception_msg_abi_cxx11_,in_RDX);
  swig_last_exception_cstr = (char *)std::__cxx11::string::c_str();
  return;
}

Assistant:

SWIGEXPORT void SWIG_store_exception(const char *decl,
                                     int errcode,
                                     const char *msg) {
  ::flc_ierr = errcode;

  static std::string last_exception_msg;
  // Save the message to a std::string first
  last_exception_msg = "In ";
  last_exception_msg += decl;
  last_exception_msg += ": ";
  last_exception_msg += msg;
  swig_last_exception_cstr = last_exception_msg.c_str();
}